

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O0

void __thiscall Fl_Widget::draw_label(Fl_Widget *this,int X,int Y,int W,int H,Fl_Align a)

{
  uint uVar1;
  int iVar2;
  undefined1 local_58 [8];
  Fl_Label l1;
  Fl_Align a_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Widget *this_local;
  
  l1._44_4_ = a;
  uVar1 = flags(this);
  if ((uVar1 & 0x40) != 0) {
    fl_draw_shortcut = '\x01';
  }
  memcpy(local_58,&this->label_,0x30);
  iVar2 = active_r(this);
  if ((iVar2 == 0) && (l1.font = fl_inactive(l1.font), l1.image != (Fl_Image *)0x0)) {
    l1.value = (char *)l1.image;
  }
  Fl_Label::draw((Fl_Label *)local_58,X,Y,W,H,l1._44_4_);
  fl_draw_shortcut = '\0';
  return;
}

Assistant:

void Fl_Widget::draw_label(int X, int Y, int W, int H, Fl_Align a) const {
  if (flags()&SHORTCUT_LABEL) fl_draw_shortcut = 1;
  Fl_Label l1 = label_;
  if (!active_r()) {
    l1.color = fl_inactive((Fl_Color)l1.color);
    if (l1.deimage) l1.image = l1.deimage;
  }
  l1.draw(X,Y,W,H,a);
  fl_draw_shortcut = 0;
}